

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t * Acb_VerilogSimpleLex(char *pFileName,Abc_Nam_t *pNames)

{
  char *pcVar1;
  int Entry;
  int iVar2;
  int iVar3;
  char *pTemp;
  Vec_Int_t *p;
  int *piVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  char cVar7;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p->pArray = piVar4;
  __s = Extra_FileReadContents(pFileName);
  sVar5 = strlen(__s);
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  pcVar6 = __s;
  do {
    if (*pcVar6 == '/') {
      if (pcVar6[1] == '/') {
        cVar7 = '/';
        while ((cVar7 != '\0' && (cVar7 != '\n'))) {
          *pcVar6 = ' ';
          pcVar1 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
          cVar7 = *pcVar1;
        }
      }
    }
    else if (*pcVar6 == '\0') break;
    pcVar6 = pcVar6 + 1;
  } while( true );
  pcVar6 = strtok(__s,"  \n\r\t(),;=");
  do {
    if (pcVar6 == (char *)0x0) {
      free(__s);
      return p;
    }
    iVar2 = Abc_NamStrFindOrAdd(pNames,pcVar6,(int *)0x0);
    iVar3 = strcmp(pcVar6,"assign");
    Entry = iVar2;
    if (iVar3 == 0) {
      Entry = 6;
    }
    Vec_IntPush(p,Entry);
    if (iVar2 - 6U < 10) {
      for (; pcVar6 < __s + sVar5; pcVar6 = pcVar6 + 1) {
        cVar7 = *pcVar6;
        if ((cVar7 == '\n') || (cVar7 == '(')) goto LAB_003930e7;
      }
      cVar7 = *pcVar6;
LAB_003930e7:
      if (cVar7 != '(') goto LAB_003930f0;
    }
    else {
LAB_003930f0:
      pcVar6 = (char *)0x0;
    }
    pcVar6 = strtok(pcVar6,"  \n\r\t(),;=");
  } while( true );
}

Assistant:

Vec_Int_t * Acb_VerilogSimpleLex( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vBuffer = Vec_IntAlloc( 1000 );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pStart, * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    Acb_VerilogRemoveComments( pBuffer );
    pToken = strtok( pBuffer, "  \n\r\t(),;=" );
    while ( pToken )
    {
        int iToken = Abc_NamStrFindOrAdd( pNames, pToken, NULL );
        if ( !strcmp(pToken, "assign") )
            Vec_IntPush( vBuffer, ACB_BUF );
        else
            Vec_IntPush( vBuffer, iToken );
        if ( iToken >= ACB_BUF && iToken < ACB_UNUSED )
        {
            for ( pStart = pToken; pStart < pLimit && *pStart != '\n'; pStart++ )
                if ( *pStart == '(' )
                    break;
            if ( *pStart == '(' )
            {
                pToken = strtok( pStart, "  \n\r\t(),;=" );
                continue;
            }
        }
        pToken = strtok( NULL, "  \n\r\t(),;=" );
    }
    ABC_FREE( pBuffer );
    return vBuffer;
}